

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool pugi::impl::(anonymous_namespace)::set_value_integer<unsigned_int,char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,uint value,bool negative)

{
  bool bVar1;
  byte *pbVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  char_t buf [64];
  byte abStack_48 [62];
  byte local_a [2];
  
  pbVar2 = local_a + 1;
  uVar5 = (ulong)(uint)-(int)header_mask;
  if (value == 0) {
    uVar5 = header_mask & 0xffffffff;
  }
  lVar3 = (ulong)(value + 1 & 1) - 1;
  do {
    uVar4 = (uint)uVar5;
    *pbVar2 = (char)uVar5 + (char)(uVar5 / 10) * -10 | 0x30;
    pbVar2 = pbVar2 + -1;
    lVar3 = lVar3 + -1;
    uVar5 = uVar5 / 10;
  } while (9 < uVar4);
  if (abStack_48 <= pbVar2) {
    *pbVar2 = 0x2d;
    bVar1 = strcpy_insitu<char*,unsigned_long>
                      (dest,header,0x10,(char_t *)(pbVar2 + (byte)((byte)value ^ 1)),-lVar3);
    return bVar1;
  }
  __assert_fail("result >= begin",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                ,0x120d,
                "char_t *pugi::impl::(anonymous namespace)::integer_to_string(char_t *, char_t *, U, bool) [U = unsigned int]"
               );
}

Assistant:

PUGI__FN bool set_value_integer(String& dest, Header& header, uintptr_t header_mask, U value, bool negative)
	{
		char_t buf[64];
		char_t* end = buf + sizeof(buf) / sizeof(buf[0]);
		char_t* begin = integer_to_string(buf, end, value, negative);

		return strcpy_insitu(dest, header, header_mask, begin, end - begin);
	}